

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

void __thiscall slang::SVInt::initSlowCase(SVInt *this,uint64_t value)

{
  uint64_t *__s;
  ulong uVar1;
  uint uVar2;
  
  uVar2 = ((this->super_SVIntStorage).bitWidth + 0x3f >> 6) <<
          ((this->super_SVIntStorage).unknownFlag & 0x1fU);
  __s = (uint64_t *)operator_new__((ulong)(uVar2 * 8));
  memset(__s,0,(ulong)(uVar2 * 8));
  (this->super_SVIntStorage).field_0.pVal = __s;
  *__s = value;
  if ((((long)value < 0) && ((this->super_SVIntStorage).signFlag != false)) && (1 < uVar2)) {
    uVar1 = 1;
    do {
      (this->super_SVIntStorage).field_0.pVal[uVar1] = 0xffffffffffffffff;
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  return;
}

Assistant:

void SVInt::initSlowCase(uint64_t value) {
    uint32_t words = getNumWords();
    pVal = new uint64_t[words](); // allocation is zero cleared
    pVal[0] = value;

    // sign extend if necessary
    if (signFlag && int64_t(value) < 0) {
        for (uint32_t i = 1; i < words; i++)
            pVal[i] = (uint64_t)(-1);
    }
}